

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-grammar.cpp
# Opt level: O3

pair<unsigned_int,_const_char_*> parse_hex(char *src,int size)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  runtime_error *this;
  long *plVar4;
  long *plVar5;
  int iVar6;
  pair<unsigned_int,_const_char_*> pVar7;
  string sStack_a8;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pVar7.second = src + (uint)size;
  uVar3 = 0;
  if (size != 0) {
    do {
      cVar1 = *src;
      iVar6 = (int)cVar1;
      if (iVar6 == 0) break;
      uVar2 = (int)uVar3 * 0x10;
      uVar3 = (ulong)uVar2;
      if ((byte)(cVar1 + 0x9fU) < 6) {
        uVar3 = (ulong)((uVar2 + iVar6) - 0x57);
      }
      else if ((byte)(cVar1 + 0xbfU) < 6) {
        uVar3 = (ulong)((uVar2 + iVar6) - 0x37);
      }
      else {
        if (9 < (byte)(cVar1 - 0x30U)) break;
        uVar3 = (ulong)((uVar2 + iVar6) - 0x30);
      }
      src = src + 1;
    } while (src < pVar7.second);
  }
  if (src == pVar7.second) {
    pVar7._0_8_ = uVar3;
    return pVar7;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&sStack_a8,size);
  std::operator+(&local_48,"expecting ",&sStack_a8);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_88 = (long *)*plVar4;
  plVar5 = plVar4 + 2;
  if (local_88 == plVar5) {
    local_78 = *plVar5;
    lStack_70 = plVar4[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar5;
  }
  local_80 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_88);
  local_68 = (long *)*plVar4;
  plVar5 = plVar4 + 2;
  if (local_68 == plVar5) {
    local_58 = *plVar5;
    lStack_50 = plVar4[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar5;
  }
  local_60 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::runtime_error::runtime_error(this,(string *)&local_68);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static std::pair<uint32_t, const char *> parse_hex(const char * src, int size) {
    const char * pos   = src;
    const char * end   = src + size;
    uint32_t     value = 0;
    for ( ; pos < end && *pos; pos++) {
        value <<= 4;
        char c = *pos;
        if ('a' <= c && c <= 'f') {
            value += c - 'a' + 10;
        } else if ('A' <= c && c <= 'F') {
            value += c - 'A' + 10;
        } else if ('0' <= c && c <= '9') {
            value += c - '0';
        } else {
            break;
        }
    }
    if (pos != end) {
        throw std::runtime_error("expecting " + std::to_string(size) + " hex chars at " + src);
    }
    return std::make_pair(value, pos);
}